

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O2

bool __thiscall cmFileCopier::Install(cmFileCopier *this,string *fromFile,string *toFile)

{
  cmCommand *this_00;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  MatchProperties match_properties;
  string newToFile;
  string newFromFile;
  string local_1c0;
  string local_1a0 [11];
  
  if (fromFile->_M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::operator<<((ostream *)local_1a0,"INSTALL encountered an empty string input file name.");
    this_00 = &this->FileCommand->super_cmCommand;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(this_00,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    uVar2 = 0;
  }
  else {
    match_properties = CollectMatchProperties(this,fromFile);
    uVar2 = 1;
    if ((((ulong)match_properties & 1) == 0) &&
       (bVar1 = cmsys::SystemTools::SameFile(fromFile,toFile), !bVar1)) {
      std::__cxx11::string::string((string *)local_1a0,(string *)fromFile);
      std::__cxx11::string::string((string *)&local_1c0,(string *)toFile);
      if ((this->FollowSymlinkChain != true) ||
         (bVar1 = InstallSymlinkChain(this,local_1a0,&local_1c0), bVar1)) {
        bVar1 = cmsys::SystemTools::FileIsSymlink(local_1a0);
        if (bVar1) {
          uVar2 = InstallSymlink(this,local_1a0,&local_1c0);
        }
        else {
          bVar1 = cmsys::SystemTools::FileIsDirectory(local_1a0);
          if (bVar1) {
            uVar2 = InstallDirectory(this,local_1a0,&local_1c0,match_properties);
          }
          else {
            bVar1 = cmsys::SystemTools::FileExists(local_1a0);
            if (bVar1) {
              uVar2 = InstallFile(this,local_1a0,&local_1c0,match_properties);
            }
            else {
              iVar3 = (*this->_vptr_cmFileCopier[5])(this,local_1a0);
              uVar2 = (undefined1)iVar3;
            }
          }
        }
      }
      else {
        uVar2 = 0;
      }
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)local_1a0);
    }
  }
  return (bool)uVar2;
}

Assistant:

bool cmFileCopier::Install(const std::string& fromFile,
                           const std::string& toFile)
{
  if (fromFile.empty()) {
    std::ostringstream e;
    e << "INSTALL encountered an empty string input file name.";
    this->FileCommand->SetError(e.str());
    return false;
  }

  // Collect any properties matching this file name.
  MatchProperties match_properties = this->CollectMatchProperties(fromFile);

  // Skip the file if it is excluded.
  if (match_properties.Exclude) {
    return true;
  }

  if (cmSystemTools::SameFile(fromFile, toFile)) {
    return true;
  }

  std::string newFromFile = fromFile;
  std::string newToFile = toFile;

  if (this->FollowSymlinkChain &&
      !this->InstallSymlinkChain(newFromFile, newToFile)) {
    return false;
  }

  if (cmSystemTools::FileIsSymlink(newFromFile)) {
    return this->InstallSymlink(newFromFile, newToFile);
  }
  if (cmSystemTools::FileIsDirectory(newFromFile)) {
    return this->InstallDirectory(newFromFile, newToFile, match_properties);
  }
  if (cmSystemTools::FileExists(newFromFile)) {
    return this->InstallFile(newFromFile, newToFile, match_properties);
  }
  return this->ReportMissing(newFromFile);
}